

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

void ompt_post_init(void)

{
  ompt_initialize_t p_Var1;
  ompt_callback_thread_begin_t p_Var2;
  int iVar3;
  uint uVar4;
  ompt_data_t *poVar5;
  kmp_info_t *pkVar6;
  ompt_data_t *local_38;
  ompt_data_t *task_data;
  ompt_data_t *parallel_data;
  ompt_frame_t *task_frame;
  
  if ((ompt_post_init::ompt_post_initialized == '\0') &&
     (ompt_post_init::ompt_post_initialized = '\x01',
     ompt_start_tool_result != (ompt_start_tool_result_t *)0x0)) {
    p_Var1 = ompt_start_tool_result->initialize;
    iVar3 = omp_get_initial_device();
    iVar3 = (*p_Var1)(ompt_fn_lookup,iVar3,&ompt_start_tool_result->tool_data);
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffffe | (ulong)(iVar3 != 0));
    if (iVar3 == 0) {
      ompt_enabled = (ompt_callbacks_active_t)0x0;
    }
    else {
      uVar4 = __kmp_get_global_thread_id();
      if ((int)uVar4 < 0) {
        pkVar6 = (kmp_info_t *)0x0;
      }
      else {
        pkVar6 = __kmp_threads[uVar4];
      }
      *(char *)((long)pkVar6 + 0x160) = '\x01';
      p_Var2 = ompt_callbacks.ompt_callback_thread_begin_callback;
      *(char *)((long)pkVar6 + 0x161) = '\x01';
      *(char *)((long)pkVar6 + 0x162) = '\0';
      *(char *)((long)pkVar6 + 0x163) = '\0';
      if (((ulong)ompt_enabled & 2) != 0) {
        poVar5 = __ompt_get_thread_data_internal();
        (*p_Var2)(ompt_thread_initial,poVar5);
      }
      local_38 = (ompt_data_t *)0x0;
      parallel_data = (ompt_data_t *)0x0;
      task_data = (ompt_data_t *)0x0;
      __ompt_get_task_info_internal
                (0,(int *)0x0,&local_38,(ompt_frame_t **)&parallel_data,&task_data,(int *)0x0);
      if (((ulong)ompt_enabled & 0x80) != 0) {
        parallel_data->ptr = &stack0xfffffffffffffff8;
        *(undefined4 *)(parallel_data + 2) = 0x20;
        (*ompt_callbacks.ompt_callback_implicit_task_callback)
                  (ompt_scope_begin,task_data,local_38,1,1,1);
        parallel_data->value = 0;
        *(undefined4 *)(parallel_data + 2) = 0;
      }
      *(char *)((long)pkVar6 + 0x160) = '\0';
      *(char *)((long)pkVar6 + 0x161) = '\0';
      *(char *)((long)pkVar6 + 0x162) = '\0';
      *(char *)((long)pkVar6 + 0x163) = '\0';
    }
  }
  return;
}

Assistant:

void ompt_post_init() {
  //--------------------------------------------------
  // Execute the post-initialization logic only once.
  //--------------------------------------------------
  static int ompt_post_initialized = 0;

  if (ompt_post_initialized)
    return;

  ompt_post_initialized = 1;

  //--------------------------------------------------
  // Initialize the tool if so indicated.
  //--------------------------------------------------
  if (ompt_start_tool_result) {
    ompt_enabled.enabled = !!ompt_start_tool_result->initialize(
        ompt_fn_lookup, omp_get_initial_device(), &(ompt_start_tool_result->tool_data));

    if (!ompt_enabled.enabled) {
      // tool not enabled, zero out the bitmap, and done
      memset(&ompt_enabled, 0, sizeof(ompt_enabled));
      return;
    }

    kmp_info_t *root_thread = ompt_get_thread();

    ompt_set_thread_state(root_thread, ompt_state_overhead);

    if (ompt_enabled.ompt_callback_thread_begin) {
      ompt_callbacks.ompt_callback(ompt_callback_thread_begin)(
          ompt_thread_initial, __ompt_get_thread_data_internal());
    }
    ompt_data_t *task_data = nullptr;
    ompt_frame_t *task_frame = nullptr;
    ompt_data_t *parallel_data = nullptr;
    __ompt_get_task_info_internal(0, NULL, &task_data, &task_frame, 
				  &parallel_data, NULL);
    if (ompt_enabled.ompt_callback_implicit_task) {
      OMPT_FRAME_SET(task_frame, exit, OMPT_GET_FRAME_ADDRESS(0),
		     (ompt_frame_runtime | OMPT_FRAME_POSITION_DEFAULT));   
      ompt_callbacks.ompt_callback(ompt_callback_implicit_task)(
        ompt_scope_begin, parallel_data /*parallel data*/, 
	task_data, 1 /*team size*/, 1 /*initial task: index=1*/, 
	ompt_task_initial);
      OMPT_FRAME_CLEAR(task_frame, exit);
    }

    ompt_set_thread_state(root_thread, ompt_state_work_serial);
  }
}